

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_cry_Rsa.cpp
# Opt level: O3

bool __thiscall
axl::cry::Rsa::generate(Rsa *this,uint_t keyLength,uint_t publicExponent,BN_GENCB *callback)

{
  bool bVar1;
  int iVar2;
  BigNum bigNum;
  Handle<bignum_st_*,_axl::cry::FreeBigNum,_axl::sl::Zero<bignum_st_*>_> local_30;
  
  BigNum::BigNum((BigNum *)&local_30);
  bVar1 = BigNum::create((BigNum *)&local_30);
  if (bVar1) {
    iVar2 = BN_set_word((BIGNUM *)local_30.m_h,(ulong)publicExponent);
    bVar1 = completeWithLastCryptoError<bool>(iVar2 != 0,false);
    if (bVar1) {
      iVar2 = RSA_generate_key_ex((RSA *)(this->
                                         super_Handle<rsa_st_*,_axl::cry::FreeRsa,_axl::sl::Zero<rsa_st_*>_>
                                         ).m_h,keyLength,(BIGNUM *)local_30.m_h,(BN_GENCB *)callback
                                 );
      bVar1 = completeWithLastCryptoError<bool>(iVar2 != 0,false);
      goto LAB_0012a3db;
    }
  }
  bVar1 = false;
LAB_0012a3db:
  sl::Handle<bignum_st_*,_axl::cry::FreeBigNum,_axl::sl::Zero<bignum_st_*>_>::~Handle(&local_30);
  return bVar1;
}

Assistant:

bool
Rsa::generate(
	uint_t keyLength,
	uint_t publicExponent,
	BN_GENCB* callback
) {
	BigNum bigNum;

	return
		bigNum.create() &&
		bigNum.setWord(publicExponent) &&
		generate(keyLength, bigNum, callback);
}